

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

Real amrex::MultiFab::Dot
               (iMultiFab *mask,MultiFab *x,int xcomp,MultiFab *y,int ycomp,int numcomp,int nghost,
               bool local)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int k;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int j;
  long lVar15;
  long lVar16;
  Real local_208;
  Box local_16c;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_int> local_d0;
  MFIter mfi;
  
  uVar2 = (ulong)(uint)numcomp;
  MFIter::MFIter(&mfi,(FabArrayBase *)x,true);
  if (numcomp < 1) {
    uVar2 = 0;
  }
  local_208 = 0.0;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_16c,&mfi,nghost);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,&x->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_150,&y->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              (&local_d0,&mask->super_FabArray<amrex::IArrayBox>,&mfi);
    lVar1 = (long)local_16c.smallend.vect[0];
    lVar15 = (long)local_16c.smallend.vect[1];
    lVar10 = (long)local_16c.smallend.vect[2];
    lVar8 = (long)xcomp * 8 * local_110.nstride +
            (lVar15 - local_110.begin.y) * local_110.jstride * 8 +
            (lVar10 - local_110.begin.z) * local_110.kstride * 8 + lVar1 * 8 +
            (long)local_110.begin.x * -8 + (long)local_110.p;
    lVar11 = (long)ycomp * 8 * local_150.nstride +
             (lVar15 - local_150.begin.y) * local_150.jstride * 8 +
             (lVar10 - local_150.begin.z) * local_150.kstride * 8 + lVar1 * 8 +
             (long)local_150.begin.x * -8 + (long)local_150.p;
    for (uVar5 = 0; lVar4 = lVar8,
        lVar6 = (lVar15 - local_d0.begin.y) * local_d0.jstride * 4 +
                (lVar10 - local_d0.begin.z) * local_d0.kstride * 4 + lVar1 * 4 +
                (long)local_d0.begin.x * -4 + (long)local_d0.p, lVar9 = lVar10, lVar12 = lVar11,
        uVar5 != uVar2; uVar5 = uVar5 + 1) {
      for (; lVar3 = lVar4, lVar13 = lVar12, lVar14 = lVar6, lVar16 = lVar15,
          lVar9 <= local_16c.bigend.vect[2]; lVar9 = lVar9 + 1) {
        for (; lVar16 <= local_16c.bigend.vect[1]; lVar16 = lVar16 + 1) {
          for (lVar7 = 0; lVar1 + lVar7 <= (long)local_16c.bigend.vect[0]; lVar7 = lVar7 + 1) {
            if (*(int *)(lVar14 + lVar7 * 4) != 0) {
              local_208 = local_208 +
                          *(double *)(lVar3 + lVar7 * 8) * *(double *)(lVar13 + lVar7 * 8);
            }
          }
          lVar3 = lVar3 + local_110.jstride * 8;
          lVar13 = lVar13 + local_150.jstride * 8;
          lVar14 = lVar14 + local_d0.jstride * 4;
        }
        lVar4 = lVar4 + local_110.kstride * 8;
        lVar6 = lVar6 + local_d0.kstride * 4;
        lVar12 = lVar12 + local_150.kstride * 8;
      }
      lVar8 = lVar8 + local_110.nstride * 8;
      lVar11 = lVar11 + local_150.nstride * 8;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return local_208;
}

Assistant:

Real
MultiFab::Dot (const iMultiFab& mask,
               const MultiFab& x, int xcomp,
               const MultiFab& y, int ycomp,
               int numcomp, int nghost, bool local)
{
    BL_ASSERT(x.boxArray() == y.boxArray());
    BL_ASSERT(x.boxArray() == mask.boxArray());
    BL_ASSERT(x.DistributionMap() == y.DistributionMap());
    BL_ASSERT(x.DistributionMap() == mask.DistributionMap());
    BL_ASSERT(x.nGrow() >= nghost && y.nGrow() >= nghost);
    BL_ASSERT(mask.nGrow() >= nghost);

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& xma = x.const_arrays();
        auto const& yma = y.const_arrays();
        auto const& mma = mask.const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, x, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            Real t = Real(0.0);
            if (mma[box_no](i,j,k)) {
                auto const& xfab = xma[box_no];
                auto const& yfab = yma[box_no];
                for (int n = 0; n < numcomp; ++n) {
                    t += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
                }
            }
            return t;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(x,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.growntilebox(nghost);
            Array4<Real const> const& xfab = x.const_array(mfi);
            Array4<Real const> const& yfab = y.const_array(mfi);
            Array4<int const> const& mfab = mask.const_array(mfi);
            AMREX_LOOP_4D(bx, numcomp, i, j, k, n,
            {
                if (mfab(i,j,k)) {
                    sm += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
                }
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}